

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O2

Block * __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::
FreeList<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::Block>::
try_get(FreeList<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
        *this)

{
  atomic<unsigned_int> *paVar1;
  __int_type_conflict1 _Var2;
  uint uVar3;
  __pointer_type pBVar4;
  Block *node;
  bool bVar5;
  
  pBVar4 = (this->freeListHead)._M_b._M_p;
LAB_00116f11:
  do {
    node = pBVar4;
    if (node == (Block *)0x0) {
      return (Block *)0x0;
    }
    uVar3 = (node->freeListRefs).super___atomic_base<unsigned_int>._M_i;
    if ((uVar3 & 0x7fffffff) != 0) {
      LOCK();
      bVar5 = uVar3 == (node->freeListRefs).super___atomic_base<unsigned_int>._M_i;
      if (bVar5) {
        (node->freeListRefs).super___atomic_base<unsigned_int>._M_i = uVar3 + 1;
      }
      UNLOCK();
      if (bVar5) {
        LOCK();
        pBVar4 = (this->freeListHead)._M_b._M_p;
        bVar5 = node == pBVar4;
        if (bVar5) {
          (this->freeListHead)._M_b._M_p = (node->freeListNext)._M_b._M_p;
          pBVar4 = node;
        }
        UNLOCK();
        if (bVar5) {
          LOCK();
          (node->freeListRefs).super___atomic_base<unsigned_int>._M_i =
               (node->freeListRefs).super___atomic_base<unsigned_int>._M_i - 2;
          UNLOCK();
          return node;
        }
        LOCK();
        paVar1 = &node->freeListRefs;
        _Var2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if (_Var2 == 0x80000001) {
          add_knowing_refcount_is_zero(this,node);
        }
        goto LAB_00116f11;
      }
    }
    pBVar4 = (this->freeListHead)._M_b._M_p;
  } while( true );
}

Assistant:

inline N* try_get()
        {
#if MCDBGQ_NOLOCKFREE_FREELIST
            debug::DebugLock lock(mutex);
#endif      
            auto head = freeListHead.load(std::memory_order_acquire);
            while (head != nullptr) {
                auto prevHead = head;
                auto refs = head->freeListRefs.load(std::memory_order_relaxed);
                if ((refs & REFS_MASK) == 0 || !head->freeListRefs.compare_exchange_strong(refs, refs + 1, std::memory_order_acquire, std::memory_order_relaxed)) {
                    head = freeListHead.load(std::memory_order_acquire);
                    continue;
                }
                
                // Good, reference count has been incremented (it wasn't at zero), which means we can read the
                // next and not worry about it changing between now and the time we do the CAS
                auto next = head->freeListNext.load(std::memory_order_relaxed);
                if (freeListHead.compare_exchange_strong(head, next, std::memory_order_acquire, std::memory_order_relaxed)) {
                    // Yay, got the node. This means it was on the list, which means shouldBeOnFreeList must be false no
                    // matter the refcount (because nobody else knows it's been taken off yet, it can't have been put back on).
                    assert((head->freeListRefs.load(std::memory_order_relaxed) & SHOULD_BE_ON_FREELIST) == 0);
                    
                    // Decrease refcount twice, once for our ref, and once for the list's ref
                    head->freeListRefs.fetch_sub(2, std::memory_order_release);
                    return head;
                }
                
                // OK, the head must have changed on us, but we still need to decrease the refcount we increased.
                // Note that we don't need to release any memory effects, but we do need to ensure that the reference
                // count decrement happens-after the CAS on the head.
                refs = prevHead->freeListRefs.fetch_sub(1, std::memory_order_acq_rel);
                if (refs == SHOULD_BE_ON_FREELIST + 1) {
                    add_knowing_refcount_is_zero(prevHead);
                }
            }
            
            return nullptr;
        }